

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O2

void __thiscall
sptk::world::Harvest
          (world *this,double *x,int x_length,int fs,HarvestOption *option,
          double *temporal_positions,double *f0)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double *temporal_positions_00;
  double *f0_00;
  undefined4 in_register_0000000c;
  double *pdVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double in_XMM3_Qa;
  
  pdVar4 = (double *)CONCAT44(in_register_0000000c,fs);
  dVar8 = (double)x_length;
  iVar2 = matlab_round(dVar8 / 8000.0);
  iVar3 = (int)x;
  if ((pdVar4[2] == 1.0) && (!NAN(pdVar4[2]))) {
    anon_unknown_5::HarvestGeneralBody
              ((double *)this,iVar3,x_length,iVar2,*pdVar4,pdVar4[1],pdVar4[3],(int)option,
               in_XMM3_Qa,temporal_positions,f0);
    return;
  }
  dVar8 = ((double)iVar3 * 1000.0) / dVar8;
  iVar6 = (int)dVar8;
  uVar7 = 0xffffffffffffffff;
  if (-2 < iVar6) {
    uVar7 = (long)iVar6 * 8 + 8;
  }
  temporal_positions_00 = (double *)operator_new__(uVar7);
  f0_00 = (double *)operator_new__(uVar7);
  anon_unknown_5::HarvestGeneralBody
            ((double *)this,iVar3,x_length,iVar2,*pdVar4,pdVar4[1],pdVar4[3],(int)f0_00,in_XMM3_Qa,
             temporal_positions_00,f0_00);
  dVar1 = pdVar4[2];
  for (lVar5 = 0; lVar5 <= (int)(dVar8 / dVar1); lVar5 = lVar5 + 1) {
    dVar9 = ((double)(int)lVar5 * pdVar4[2]) / 1000.0;
    (&option->f0_floor)[lVar5] = dVar9;
    iVar3 = matlab_round(dVar9 * 1000.0);
    iVar2 = iVar6;
    if (iVar3 <= iVar6) {
      iVar2 = iVar3;
    }
    temporal_positions[lVar5] = temporal_positions_00[iVar2];
  }
  operator_delete__(temporal_positions_00);
  operator_delete__(f0_00);
  return;
}

Assistant:

void Harvest(const double *x, int x_length, int fs,
    const HarvestOption *option, double *temporal_positions, double *f0) {
  // Several parameters will be controllable for debug.
  double target_fs = 8000.0;
  int dimension_ratio = matlab_round(fs / target_fs);
  double channels_in_octave = 40;

  if (option->frame_period == 1.0) {
    HarvestGeneralBody(x, x_length, fs, 1, option->f0_floor,
        option->f0_ceil, channels_in_octave, dimension_ratio,
#if 0
        temporal_positions, f0);
#else
        option->allowed_range, temporal_positions, f0);
#endif
    return;
  }

  int basic_frame_period = 1;
  int basic_f0_length =
    GetSamplesForHarvest(fs, x_length, basic_frame_period);
  double *basic_f0 = new double[basic_f0_length];
  double *basic_temporal_positions = new double[basic_f0_length];
  HarvestGeneralBody(x, x_length, fs, basic_frame_period, option->f0_floor,
      option->f0_ceil, channels_in_octave, dimension_ratio,
#if 0
      basic_temporal_positions, basic_f0);
#else
      option->allowed_range, basic_temporal_positions, basic_f0);
#endif

  int f0_length = GetSamplesForHarvest(fs, x_length, option->frame_period);
  for (int i = 0; i < f0_length; ++i) {
    temporal_positions[i] = i * option->frame_period / 1000.0;
    f0[i] = basic_f0[MyMinInt(basic_f0_length - 1,
      matlab_round(temporal_positions[i] * 1000.0))];
  }

  delete[] basic_f0;
  delete[] basic_temporal_positions;
}